

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

float tcu::anon_unknown_3::maximalRangeDivision
                (float minDividend,float maxDividend,float minDivisor,float maxDivisor)

{
  float x;
  float y;
  float maxDivisor_local;
  float minDivisor_local;
  float maxDividend_local;
  float minDividend_local;
  
  if ((((minDividend != 0.0) || (NAN(minDividend))) || (maxDividend != 0.0)) || (NAN(maxDividend)))
  {
    if ((0.0 < minDivisor) || (maxDivisor < 0.0)) {
      x = de::max<float>(minDividend / minDivisor,minDividend / maxDivisor);
      y = de::max<float>(maxDividend / minDivisor,maxDividend / maxDivisor);
      maxDividend_local = de::max<float>(x,y);
    }
    else {
      maxDividend_local = std::numeric_limits<float>::infinity();
    }
  }
  else {
    maxDividend_local = 0.0;
  }
  return maxDividend_local;
}

Assistant:

float maximalRangeDivision (float minDividend, float maxDividend, float minDivisor, float maxDivisor)
{
	DE_ASSERT(minDividend <= maxDividend);
	DE_ASSERT(minDivisor <= maxDivisor);

	// special cases
	if (minDividend == 0.0f && maxDividend == 0.0f)
		return 0.0f;
	if (minDivisor <= 0.0f && maxDivisor >= 0.0f)
		return std::numeric_limits<float>::infinity();

	return de::max(de::max(minDividend / minDivisor, minDividend / maxDivisor), de::max(maxDividend / minDivisor, maxDividend / maxDivisor));
}